

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O3

bool __thiscall RoboClaw::ReadCurrents(RoboClaw *this,int16_t *current1,int16_t *current2)

{
  uint32_t uVar1;
  bool valid;
  bool local_19;
  
  uVar1 = Read4(this,this->m_address,'1',&local_19);
  if (local_19 == true) {
    *current1 = (int16_t)(uVar1 >> 0x10);
    *current2 = (int16_t)uVar1;
  }
  return local_19;
}

Assistant:

bool RoboClaw::ReadCurrents( int16_t &current1, int16_t &current2)
{
    bool valid;
    uint32_t value = Read4( m_address, GETCURRENTS,&valid);
    if(valid)
    {
        current1 = value>>16;
        current2 = value&0xFFFF;
    }
    return valid;
}